

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t tinyexr::SaveEXRNPartImageToMemory
                 (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar **memory_out,
                 char **err)

{
  const_iterator __position;
  const_iterator __position_00;
  int iVar1;
  iterator exr_image;
  iterator channels_00;
  reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  ulong uVar5;
  void *pvVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  size_type sVar10;
  reference pvVar11;
  size_t sVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  long *in_RCX;
  long lVar16;
  uint in_EDX;
  long *in_RSI;
  long *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  uint part_number;
  size_t j_2;
  uint i_5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets;
  size_t num_bytes_1;
  size_t num_bytes;
  size_t j_1;
  int level_index;
  int num_levels;
  EXRImage *level_image;
  uint i_4;
  size_t sum;
  uchar *memory_ptr;
  int ret;
  string e;
  uint i_3;
  vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  data_lists;
  tinyexr_uint64 total_size;
  tinyexr_uint64 chunk_offset;
  int j;
  char *type;
  size_t len;
  uchar *data_2;
  uint datai [3];
  uchar tile_mode;
  float w;
  float center [2];
  float aspectRatio;
  uchar line_order;
  int data0 [4];
  int data_1 [4];
  int comp;
  ChannelInfo info;
  int c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint i_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partnames;
  vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
  channels;
  vector<int,_std::allocator<int>_> num_y_tiles;
  vector<int,_std::allocator<int>_> num_x_tiles;
  int num_scanlines;
  uint i_1;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> offset_data;
  vector<int,_std::allocator<int>_> chunk_count;
  int total_chunk_count;
  char marker [4];
  int long_name;
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  uint i;
  reference in_stack_fffffffffffffa18;
  string *in_stack_fffffffffffffa20;
  value_type *in_stack_fffffffffffffa28;
  EXRHeader *in_stack_fffffffffffffa30;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa38;
  uint *puVar18;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa68;
  undefined4 in_stack_fffffffffffffa6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa70;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa78;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa80;
  long lVar19;
  EXRHeader *in_stack_fffffffffffffa88;
  allocator *paVar20;
  OffsetData *in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffac4;
  uchar *in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffad8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffae0;
  undefined8 uVar21;
  undefined1 *chunk_offset_00;
  undefined1 *puVar22;
  EXRHeader *exr_header;
  uint local_41c;
  ulong local_418;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  uint uVar23;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffbf8;
  tinyexr_uint64 *in_stack_fffffffffffffc00;
  string *in_stack_fffffffffffffc08;
  size_type local_3f0;
  int local_3e8;
  uint local_3d4;
  uint *local_3c8;
  allocator local_3b9;
  string local_3b8 [36];
  int local_394;
  undefined1 local_390 [64];
  size_t local_350;
  size_t local_348;
  undefined1 local_33e;
  undefined1 local_33d;
  int local_33c;
  char *local_338;
  allocator local_329;
  string local_328 [32];
  int local_308;
  allocator local_301;
  string local_300 [32];
  _Base_ptr local_2e0;
  char local_2d8;
  size_t local_2d0;
  uint *local_2c8;
  uint local_2c0;
  undefined4 uStack_2bc;
  byte local_2b8 [11];
  byte local_2ad;
  float local_2ac;
  float local_2a8 [2];
  float local_2a0;
  char local_299;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c [3];
  int local_270;
  allocator local_269;
  string local_268 [32];
  string local_248 [32];
  char local_228 [4];
  char local_224 [4];
  char local_220 [20];
  int local_20c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  uint local_1ec;
  vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
  local_1b0 [3];
  int local_164;
  uint local_160;
  vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> local_158;
  undefined1 local_139;
  vector<int,_std::allocator<int>_> local_138;
  int local_11c;
  uchar *local_118;
  uchar *local_110;
  uint local_100;
  int local_fc;
  uchar *local_f8;
  uchar *local_f0;
  undefined4 local_dc;
  undefined1 local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  uint local_70;
  allocator local_59;
  string local_58 [40];
  long *local_30;
  uint local_24;
  long *local_20;
  long *local_18;
  size_t local_10;
  
  if ((((in_RDI == (long *)0x0) || (in_RSI == (long *)0x0)) || (in_EDX == 0)) ||
     (in_RCX == (long *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_58,"Invalid argument for SaveEXRNPartImageToMemory",&local_59);
    SetErrorMessage(in_stack_fffffffffffffa20,(char **)in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    local_10 = 0;
  }
  else {
    for (local_70 = 0; local_70 < in_EDX; local_70 = local_70 + 1) {
      if (*(int *)(in_RSI[local_70] + 0x7c) < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_90,"Invalid argument for SaveEXRNPartImageToMemory",&local_91);
        SetErrorMessage(in_stack_fffffffffffffa20,(char **)in_stack_fffffffffffffa18);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        return 0;
      }
      if (*(int *)(in_RSI[local_70] + 0x7c) == 0x80) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b8,"ZFP compression is not supported in this build",
                   (allocator *)(local_d8 + 0x1f));
        SetErrorMessage(in_stack_fffffffffffffa20,(char **)in_stack_fffffffffffffa18);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0x1f));
        return 0;
      }
    }
    exr_header = (EXRHeader *)local_d8;
    local_30 = in_RCX;
    local_24 = in_EDX;
    local_20 = in_RSI;
    local_18 = in_RDI;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x44a242);
    local_dc = 0x1312f76;
    local_f0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffa18);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa20,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa18);
    __position._M_current._4_4_ = in_stack_fffffffffffffa6c;
    __position._M_current._0_4_ = in_stack_fffffffffffffa68;
    exr_image = std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char_const*,void>
                          (in_stack_fffffffffffffa60,__position,in_stack_fffffffffffffa58,
                           in_stack_fffffffffffffa50);
    local_fc = *(int *)(*local_20 + 0x4c);
    local_100 = 2;
    if ((local_24 == 1) && (*local_18 != 0)) {
      local_100 = 0x202;
    }
    if (local_fc != 0) {
      local_100 = local_100 | 0x400;
    }
    if (1 < local_24) {
      local_100 = local_100 | 0x1000;
    }
    puVar22 = local_d8;
    local_f8 = exr_image._M_current;
    local_110 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    in_stack_fffffffffffffa18);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa20,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa18);
    __position_00._M_current._4_4_ = in_stack_fffffffffffffa6c;
    __position_00._M_current._0_4_ = in_stack_fffffffffffffa68;
    channels_00 = std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char*,void>
                            (in_stack_fffffffffffffa60,__position_00,in_stack_fffffffffffffa58,
                             in_stack_fffffffffffffa50);
    local_11c = 0;
    uVar21 = 0;
    chunk_offset_00 = &local_139;
    local_118 = channels_00._M_current;
    std::allocator<int>::allocator((allocator<int> *)0x44a3f5);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,
               (size_type)in_stack_fffffffffffffa38,(allocator_type *)in_stack_fffffffffffffa30);
    std::allocator<int>::~allocator((allocator<int> *)0x44a421);
    std::allocator<tinyexr::OffsetData>::allocator((allocator<tinyexr::OffsetData> *)0x44a445);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::vector
              ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)
               in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
               (allocator_type *)in_stack_fffffffffffffa30);
    std::allocator<tinyexr::OffsetData>::~allocator((allocator<tinyexr::OffsetData> *)0x44a471);
    for (local_160 = 0; local_160 < local_24; local_160 = local_160 + 1) {
      if (local_18[(ulong)local_160 * 6] == 0) {
        local_164 = NumScanlines(*(int *)(local_20[local_160] + 0x7c));
        iVar1 = (*(int *)((long)local_18 + (ulong)local_160 * 0x30 + 0x24) + -1 + local_164) /
                local_164;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)local_160);
        *pvVar2 = iVar1;
        std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::operator[]
                  (&local_158,(ulong)local_160);
        std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)local_160);
        InitSingleResolutionOffsets
                  ((OffsetData *)in_stack_fffffffffffffa20,(size_t)in_stack_fffffffffffffa18);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)local_160);
        local_11c = *pvVar2 + local_11c;
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x44a621);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x44a636);
        PrecalculateTileInfo
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,
                   in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
        std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::operator[]
                  (&local_158,(ulong)local_160);
        iVar1 = InitTileOffsets(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                                in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)local_160);
        *pvVar2 = iVar1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)local_160);
        local_11c = *pvVar2 + local_11c;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa30);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa30);
      }
    }
    std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>::
    allocator((allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>
               *)0x44a77a);
    std::
    vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
    ::vector((vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
              *)in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
             (allocator_type *)in_stack_fffffffffffffa30);
    std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>::
    ~allocator((allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>
                *)0x44a7a6);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x44a7b3);
    for (local_1ec = 0; local_1ec < local_24; local_1ec = local_1ec + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x44a7df);
      for (local_20c = 0; local_20c < *(int *)(local_20[local_1ec] + 0x78);
          local_20c = local_20c + 1) {
        TChannelInfo::TChannelInfo((TChannelInfo *)0x44a81a);
        local_220[8] = '\0';
        local_228 = *(char (*) [4])(*(long *)(local_20[local_1ec] + 0x70) + (long)local_20c * 4);
        local_224 = *(char (*) [4])(*(long *)(local_20[local_1ec] + 0x80) + (long)local_20c * 4);
        local_220[0] = '\x01';
        local_220[1] = '\0';
        local_220[2] = '\0';
        local_220[3] = '\0';
        local_220[4] = '\x01';
        local_220[5] = '\0';
        local_220[6] = '\0';
        local_220[7] = '\0';
        lVar19 = *(long *)(local_20[local_1ec] + 0x68);
        lVar16 = (long)local_20c;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_268,(char *)(lVar19 + lVar16 * 0x110),&local_269);
        std::__cxx11::string::operator=(local_248,local_268);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator((allocator<char> *)&local_269);
        std::
        vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
        ::operator[](local_1b0,(ulong)local_1ec);
        std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::push_back
                  ((vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                   in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        TChannelInfo::~TChannelInfo((TChannelInfo *)0x44a966);
      }
      std::
      vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
      ::operator[](local_1b0,(ulong)local_1ec);
      WriteChannelInfo(in_stack_fffffffffffffa70,
                       (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                       CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa20,
                 (size_type)in_stack_fffffffffffffa18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_208);
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa30)
      ;
      local_270 = *(int *)(local_20[local_1ec] + 0x7c);
      swap4(&local_270);
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      local_288._0_1_ = '\0';
      local_288._1_1_ = '\0';
      local_288._2_1_ = '\0';
      local_288._3_1_ = '\0';
      local_284._0_1_ = '\0';
      local_284._1_1_ = '\0';
      local_284._2_1_ = '\0';
      local_284._3_1_ = '\0';
      local_280 = (int)local_18[(ulong)local_1ec * 6 + 4] + -1;
      local_27c[0] = *(int *)((long)local_18 + (ulong)local_1ec * 0x30 + 0x24) + -1;
      swap4(&local_288);
      swap4(&local_284);
      swap4(&local_280);
      swap4(local_27c);
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      local_298 = 0;
      local_294._0_1_ = '\0';
      local_294._1_1_ = '\0';
      local_294._2_1_ = '\0';
      local_294._3_1_ = '\0';
      local_290 = (int)local_18[4] + -1;
      local_28c = *(int *)((long)local_18 + 0x24) + -1;
      swap4(&local_298);
      swap4(&local_294);
      swap4(&local_290);
      swap4(&local_28c);
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      local_299 = '\0';
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      local_2a0 = 1.0;
      swap4(local_2a8 + 2);
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      local_2a8 = (float  [2])0x0;
      swap4(local_2a8);
      swap4(local_2a8 + 1);
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      local_2ac = 1.0;
      swap4(&local_2ac);
      WriteAttributeToMemory
                (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                 in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      if (local_18[(ulong)local_1ec * 6] != 0) {
        local_2ad = (byte)*(undefined4 *)(local_20[local_1ec] + 0x44) & 3;
        if (*(int *)(local_20[local_1ec] + 0x48) != 0) {
          local_2ad = local_2ad | 0x10;
        }
        local_2b8[0] = '\0';
        local_2b8[1] = '\0';
        local_2b8[2] = '\0';
        local_2b8[3] = '\0';
        local_2c8 = &local_2c0;
        uStack_2bc = *(undefined4 *)(local_20[local_1ec] + 0x40);
        local_2c0 = *(undefined4 *)(local_20[local_1ec] + 0x3c);
        local_2b8[0] = local_2ad;
        swap4(local_2c8);
        swap4(local_2c8 + 1);
        WriteAttributeToMemory
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      }
      if (1 < local_24) {
        local_2d0._0_1_ = '\0';
        local_2d0._1_1_ = '\0';
        local_2d0._2_1_ = '\0';
        local_2d0._3_1_ = '\0';
        local_2d0._4_1_ = '\0';
        local_2d0._5_1_ = '\0';
        local_2d0._6_1_ = '\0';
        local_2d0._7_1_ = '\0';
        local_2d0 = strlen((char *)(local_20[local_1ec] + 0x88));
        if (local_2d0 == 0) {
          paVar20 = &local_329;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_328,"Invalid \'name\' attribute for a multi-part file",paVar20);
          SetErrorMessage(in_stack_fffffffffffffa20,(char **)in_stack_fffffffffffffa18);
          std::__cxx11::string::~string(local_328);
          std::allocator<char>::~allocator((allocator<char> *)&local_329);
          local_10 = 0;
          local_308 = 1;
          goto LAB_0044b2b3;
        }
        pVar17 = std::
                 set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::emplace<char_const(&)[256]>
                           (in_stack_fffffffffffffa40,(char (*) [256])in_stack_fffffffffffffa38);
        local_2e0 = (_Base_ptr)pVar17.first._M_node;
        local_2d8 = pVar17.second;
        sVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x44af67);
        if (sVar3 != local_1ec + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_300,"\'name\' attributes must be unique for a multi-part file",&local_301
                    );
          SetErrorMessage(in_stack_fffffffffffffa20,(char **)in_stack_fffffffffffffa18);
          std::__cxx11::string::~string(local_300);
          std::allocator<char>::~allocator((allocator<char> *)&local_301);
          local_10 = 0;
          local_308 = 1;
          goto LAB_0044b2b3;
        }
        WriteAttributeToMemory
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
        local_338 = "scanlineimage";
        if (local_18[(ulong)local_1ec * 6] != 0) {
          local_338 = "tiledimage";
        }
        in_stack_fffffffffffffad8 = local_338;
        strlen(local_338);
        WriteAttributeToMemory
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
        std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)local_1ec);
        WriteAttributeToMemory
                  (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
      }
      if (0 < *(int *)(local_20[local_1ec] + 0x5c)) {
        for (local_33c = 0; local_33c < *(int *)(local_20[local_1ec] + 0x5c);
            local_33c = local_33c + 1) {
          WriteAttributeToMemory
                    (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                     in_stack_fffffffffffffac8,in_stack_fffffffffffffac4);
        }
      }
      local_33d = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa20,
                 (value_type_conflict3 *)in_stack_fffffffffffffa18);
    }
    local_308 = 0;
LAB_0044b2b3:
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x44b2c0);
    if (local_308 == 0) {
      if (1 < local_24) {
        local_33e = 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffa20,(value_type_conflict3 *)in_stack_fffffffffffffa18);
      }
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
      local_348 = sVar4 + (long)local_11c * 8;
      local_350 = 0;
      std::
      allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::allocator((allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)0x44b378);
      std::
      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::vector((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                *)in_stack_fffffffffffffa40,(size_type)in_stack_fffffffffffffa38,
               (allocator_type *)in_stack_fffffffffffffa30);
      std::
      allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::~allocator((allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)0x44b3a4);
      for (local_390._32_4_ = 0; (uint)local_390._32_4_ < local_24;
          local_390._32_4_ = local_390._32_4_ + 1) {
        in_stack_fffffffffffffa30 = (EXRHeader *)local_390;
        std::__cxx11::string::string((string *)in_stack_fffffffffffffa30);
        std::
        vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
        ::operator[](local_1b0,(ulong)(uint)local_390._32_4_);
        std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)(uint)local_390._32_4_)
        ;
        in_stack_fffffffffffffa18 =
             std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::operator[]
                       (&local_158,(ulong)(uint)local_390._32_4_);
        in_stack_fffffffffffffa20 =
             (string *)
             std::
             vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                           *)(local_390 + 0x28),(ulong)(uint)local_390._32_4_);
        local_394 = EncodeChunk((EXRImage *)exr_image._M_current,exr_header,
                                (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                                 *)channels_00._M_current,(int)((ulong)puVar22 >> 0x20),
                                (tinyexr_uint64)chunk_offset_00,SUB81((ulong)uVar21 >> 0x38,0),
                                (OffsetData *)
                                CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                                in_stack_fffffffffffffbf8,in_stack_fffffffffffffc00,
                                in_stack_fffffffffffffc08);
        if (local_394 == 0) {
          local_348 = local_350;
          local_308 = 0;
        }
        else {
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            SetErrorMessage(in_stack_fffffffffffffa20,(char **)in_stack_fffffffffffffa18);
          }
          local_10 = 0;
          local_308 = 1;
        }
        std::__cxx11::string::~string((string *)local_390);
        if (local_308 != 0) goto LAB_0044bcc0;
      }
      if (local_350 == 0) {
        paVar20 = &local_3b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"Output memory size is zero",paVar20);
        SetErrorMessage(in_stack_fffffffffffffa20,(char **)in_stack_fffffffffffffa18);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_10 = 0;
        local_308 = 1;
      }
      else {
        pvVar6 = malloc(local_350);
        *local_30 = (long)pvVar6;
        pvVar6 = (void *)*local_30;
        pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,0);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
        memcpy(pvVar6,pvVar7,sVar4);
        lVar19 = *local_30;
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
        local_3c8 = (uint *)(lVar19 + sVar4);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
        for (local_3d4 = 0; local_3d4 < local_24; local_3d4 = local_3d4 + 1) {
          if (local_18[(ulong)local_3d4 * 6] == 0) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)local_3d4)
            ;
            sVar12 = (long)*pvVar2 * 8;
            pvVar8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::
                     operator[](&local_158,(ulong)local_3d4);
            pvVar9 = std::
                     vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ::operator[](&pvVar8->offsets,0);
            pvVar11 = std::
                      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ::operator[](pvVar9,0);
            puVar18 = local_3c8;
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                (pvVar11,0);
            memcpy(puVar18,pvVar13,sVar12);
            local_3c8 = (uint *)(sVar12 + (long)local_3c8);
          }
          else {
            if (*(int *)(local_20[local_3d4] + 0x44) == 2) {
              pvVar8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::
                       operator[](&local_158,(ulong)local_3d4);
              iVar1 = pvVar8->num_x_levels;
              pvVar8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::
                       operator[](&local_158,(ulong)local_3d4);
              iVar1 = iVar1 * pvVar8->num_y_levels;
            }
            else {
              pvVar8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::
                       operator[](&local_158,(ulong)local_3d4);
              iVar1 = pvVar8->num_x_levels;
            }
            for (local_3e8 = 0; local_3e8 < iVar1; local_3e8 = local_3e8 + 1) {
              local_3f0 = 0;
              while( true ) {
                sVar4 = local_3f0;
                pvVar8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::
                         operator[](&local_158,(ulong)local_3d4);
                pvVar9 = std::
                         vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ::operator[](&pvVar8->offsets,(long)local_3e8);
                sVar10 = std::
                         vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ::size(pvVar9);
                if (sVar10 <= sVar4) break;
                pvVar8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::
                         operator[](&local_158,(ulong)local_3d4);
                pvVar9 = std::
                         vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ::operator[](&pvVar8->offsets,(long)local_3e8);
                pvVar11 = std::
                          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ::operator[](pvVar9,local_3f0);
                sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar11);
                sVar12 = sVar4 * 8;
                puVar18 = local_3c8;
                pvVar8 = std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::
                         operator[](&local_158,(ulong)local_3d4);
                pvVar9 = std::
                         vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                         ::operator[](&pvVar8->offsets,(long)local_3e8);
                pvVar11 = std::
                          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ::operator[](pvVar9,local_3f0);
                pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    (pvVar11,0);
                memcpy(puVar18,pvVar13,sVar12);
                local_3c8 = (uint *)(sVar12 + (long)local_3c8);
                local_3f0 = local_3f0 + 1;
              }
            }
          }
        }
        for (uVar23 = 0; uVar23 < local_24; uVar23 = uVar23 + 1) {
          for (local_418 = 0; uVar5 = local_418,
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_138,(ulong)uVar23),
              uVar5 < (ulong)(long)*pvVar2; local_418 = local_418 + 1) {
            if (1 < local_24) {
              local_41c = uVar23;
              swap4(&local_41c);
              *local_3c8 = local_41c;
              local_3c8 = local_3c8 + 1;
            }
            pvVar14 = std::
                      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                    *)(local_390 + 0x28),(ulong)uVar23);
            pvVar15 = std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator[](pvVar14,local_418);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar15);
            puVar18 = local_3c8;
            pvVar14 = std::
                      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                    *)(local_390 + 0x28),(ulong)uVar23);
            pvVar15 = std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator[](pvVar14,local_418);
            pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (pvVar15,0);
            pvVar14 = std::
                      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                    *)(local_390 + 0x28),(ulong)uVar23);
            pvVar15 = std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator[](pvVar14,local_418);
            sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar15);
            memcpy(puVar18,pvVar7,sVar4);
            pvVar14 = std::
                      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::operator[]((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                    *)(local_390 + 0x28),(ulong)uVar23);
            pvVar15 = std::
                      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ::operator[](pvVar14,local_418);
            sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar15);
            local_3c8 = (uint *)(sVar4 + (long)local_3c8);
          }
        }
        local_10 = local_350;
        local_308 = 1;
      }
LAB_0044bcc0:
      std::
      vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
      ::~vector((vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                 *)in_stack_fffffffffffffa30);
    }
    std::
    vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
    ::~vector((vector<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>,_std::allocator<std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>_>_>
               *)in_stack_fffffffffffffa30);
    std::vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_>::~vector
              ((vector<tinyexr::OffsetData,_std::allocator<tinyexr::OffsetData>_> *)
               in_stack_fffffffffffffa30);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa30);
  }
  return local_10;
}

Assistant:

static size_t SaveEXRNPartImageToMemory(const EXRImage* exr_images,
                                        const EXRHeader** exr_headers,
                                        unsigned int num_parts,
                                        unsigned char** memory_out, const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory_out == NULL) {
    SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                    err);
    return 0;
  }
  {
    for (unsigned int i = 0; i < num_parts; ++i) {
      if (exr_headers[i]->compression_type < 0) {
        SetErrorMessage("Invalid argument for SaveEXRNPartImageToMemory",
                        err);
        return 0;
      }
#if !TINYEXR_USE_PIZ
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
        SetErrorMessage("PIZ compression is not supported in this build",
                        err);
        return 0;
      }
#endif
#if !TINYEXR_USE_ZFP
      if (exr_headers[i]->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
        SetErrorMessage("ZFP compression is not supported in this build",
                        err);
        return 0;
      }
#else
      for (int c = 0; c < exr_header->num_channels; ++c) {
        if (exr_headers[i]->requested_pixel_types[c] != TINYEXR_PIXELTYPE_FLOAT) {
          SetErrorMessage("Pixel type must be FLOAT for ZFP compression",
                          err);
          return 0;
        }
      }
#endif
    }
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = { 0x76, 0x2f, 0x31, 0x01 };
    memory.insert(memory.end(), header, header + 4);
  }

  // Version
  // using value from the first header
  int long_name = exr_headers[0]->long_name;
  {
    char marker[] = { 2, 0, 0, 0 };
    /* @todo
    if (exr_header->non_image) {
    marker[1] |= 0x8;
    }
    */
    // tiled
    if (num_parts == 1 && exr_images[0].tiles) {
      marker[1] |= 0x2;
    }
    // long_name
    if (long_name) {
      marker[1] |= 0x4;
    }
    // multipart
    if (num_parts > 1) {
      marker[1] |= 0x10;
    }
    memory.insert(memory.end(), marker, marker + 4);
  }

  int total_chunk_count = 0;
  std::vector<int> chunk_count(num_parts);
  std::vector<OffsetData> offset_data(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (!exr_images[i].tiles) {
      int num_scanlines = NumScanlines(exr_headers[i]->compression_type);
      chunk_count[i] =
        (exr_images[i].height + num_scanlines - 1) / num_scanlines;
      InitSingleResolutionOffsets(offset_data[i], chunk_count[i]);
      total_chunk_count += chunk_count[i];
    } else {
      {
        std::vector<int> num_x_tiles, num_y_tiles;
        PrecalculateTileInfo(num_x_tiles, num_y_tiles, exr_headers[i]);
        chunk_count[i] =
          InitTileOffsets(offset_data[i], exr_headers[i], num_x_tiles, num_y_tiles);
        total_chunk_count += chunk_count[i];
      }
    }
  }
  // Write attributes to memory buffer.
  std::vector< std::vector<tinyexr::ChannelInfo> > channels(num_parts);
  {
    std::set<std::string> partnames;
    for (unsigned int i = 0; i < num_parts; ++i) {
      //channels
      {
        std::vector<unsigned char> data;

        for (int c = 0; c < exr_headers[i]->num_channels; c++) {
          tinyexr::ChannelInfo info;
          info.p_linear = 0;
          info.pixel_type = exr_headers[i]->pixel_types[c];
          info.requested_pixel_type = exr_headers[i]->requested_pixel_types[c];
          info.x_sampling = 1;
          info.y_sampling = 1;
          info.name = std::string(exr_headers[i]->channels[c].name);
          channels[i].push_back(info);
        }

        tinyexr::WriteChannelInfo(data, channels[i]);

        tinyexr::WriteAttributeToMemory(&memory, "channels", "chlist", &data.at(0),
                                        static_cast<int>(data.size()));
      }

      {
        int comp = exr_headers[i]->compression_type;
        swap4(&comp);
        WriteAttributeToMemory(
          &memory, "compression", "compression",
          reinterpret_cast<const unsigned char*>(&comp), 1);
      }

      {
        int data[4] = { 0, 0, exr_images[i].width - 1, exr_images[i].height - 1 };
        swap4(&data[0]);
        swap4(&data[1]);
        swap4(&data[2]);
        swap4(&data[3]);
        WriteAttributeToMemory(
          &memory, "dataWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data), sizeof(int) * 4);

        int data0[4] = { 0, 0, exr_images[0].width - 1, exr_images[0].height - 1 };
        swap4(&data0[0]);
        swap4(&data0[1]);
        swap4(&data0[2]);
        swap4(&data0[3]);
        // Note: must be the same across parts (currently, using value from the first header)
        WriteAttributeToMemory(
          &memory, "displayWindow", "box2i",
          reinterpret_cast<const unsigned char*>(data0), sizeof(int) * 4);
      }

      {
        unsigned char line_order = 0;  // @fixme { read line_order from EXRHeader }
        WriteAttributeToMemory(&memory, "lineOrder", "lineOrder",
                               &line_order, 1);
      }

      {
        // Note: must be the same across parts
        float aspectRatio = 1.0f;
        swap4(&aspectRatio);
        WriteAttributeToMemory(
          &memory, "pixelAspectRatio", "float",
          reinterpret_cast<const unsigned char*>(&aspectRatio), sizeof(float));
      }

      {
        float center[2] = { 0.0f, 0.0f };
        swap4(&center[0]);
        swap4(&center[1]);
        WriteAttributeToMemory(
          &memory, "screenWindowCenter", "v2f",
          reinterpret_cast<const unsigned char*>(center), 2 * sizeof(float));
      }

      {
        float w = 1.0f;
        swap4(&w);
        WriteAttributeToMemory(&memory, "screenWindowWidth", "float",
                               reinterpret_cast<const unsigned char*>(&w),
                               sizeof(float));
      }

      if (exr_images[i].tiles) {
        unsigned char tile_mode = static_cast<unsigned char>(exr_headers[i]->tile_level_mode & 0x3);
        if (exr_headers[i]->tile_rounding_mode) tile_mode |= (1u << 4u);
        //unsigned char data[9] = { 0, 0, 0, 0, 0, 0, 0, 0, 0 };
        unsigned int datai[3] = { 0, 0, 0 };
        unsigned char* data = reinterpret_cast<unsigned char*>(&datai[0]);
        datai[0] = static_cast<unsigned int>(exr_headers[i]->tile_size_x);
        datai[1] = static_cast<unsigned int>(exr_headers[i]->tile_size_y);
        data[8] = tile_mode;
        swap4(reinterpret_cast<unsigned int*>(&data[0]));
        swap4(reinterpret_cast<unsigned int*>(&data[4]));
        WriteAttributeToMemory(
          &memory, "tiles", "tiledesc",
          reinterpret_cast<const unsigned char*>(data), 9);
      }

      // must be present for multi-part files - according to spec.
      if (num_parts > 1) {
        // name
        {
          size_t len = 0;
          if ((len = strlen(exr_headers[i]->name)) > 0) {
            partnames.emplace(exr_headers[i]->name);
            if (partnames.size() != i + 1) {
              SetErrorMessage("'name' attributes must be unique for a multi-part file", err);
              return 0;
            }
            WriteAttributeToMemory(
              &memory, "name", "string",
              reinterpret_cast<const unsigned char*>(exr_headers[i]->name),
              static_cast<int>(len));
          } else {
            SetErrorMessage("Invalid 'name' attribute for a multi-part file", err);
            return 0;
          }
        }
        // type
        {
          const char* type = "scanlineimage";
          if (exr_images[i].tiles) type = "tiledimage";
          WriteAttributeToMemory(
            &memory, "type", "string",
            reinterpret_cast<const unsigned char*>(type),
            static_cast<int>(strlen(type)));
        }
        // chunkCount
        {
          WriteAttributeToMemory(
            &memory, "chunkCount", "int",
            reinterpret_cast<const unsigned char*>(&chunk_count[i]),
            4);
        }
      }

      // Custom attributes
      if (exr_headers[i]->num_custom_attributes > 0) {
        for (int j = 0; j < exr_headers[i]->num_custom_attributes; j++) {
          tinyexr::WriteAttributeToMemory(
            &memory, exr_headers[i]->custom_attributes[j].name,
            exr_headers[i]->custom_attributes[j].type,
            reinterpret_cast<const unsigned char*>(
              exr_headers[i]->custom_attributes[j].value),
            exr_headers[i]->custom_attributes[j].size);
        }
      }

      {  // end of header
        memory.push_back(0);
      }
    }
  }
  if (num_parts > 1) {
    // end of header list
    memory.push_back(0);
  }

  tinyexr_uint64 chunk_offset = memory.size() + size_t(total_chunk_count) * sizeof(tinyexr_uint64);

  tinyexr_uint64 total_size = 0;
  std::vector< std::vector< std::vector<unsigned char> > > data_lists(num_parts);
  for (unsigned int i = 0; i < num_parts; ++i) {
    std::string e;
    int ret = EncodeChunk(&exr_images[i], exr_headers[i],
                          channels[i],
                          chunk_count[i],
                          // starting offset of current chunk after part-number
                          chunk_offset,
                          num_parts > 1,
                          offset_data[i], // output: block offsets, must be initialized
                          data_lists[i], // output
                          total_size, // output
                          &e);
    if (ret != TINYEXR_SUCCESS) {
      if (!e.empty()) {
        tinyexr::SetErrorMessage(e, err);
      }
      return 0;
    }
    chunk_offset = total_size;
  }

  // Allocating required memory
  if (total_size == 0) { // something went wrong
    tinyexr::SetErrorMessage("Output memory size is zero", err);
    return 0;
  }
  (*memory_out) = static_cast<unsigned char*>(malloc(size_t(total_size)));

  // Writing header
  memcpy((*memory_out), &memory[0], memory.size());
  unsigned char* memory_ptr = *memory_out + memory.size();
  size_t sum = memory.size();
  ((void)(sum));

  // Writing offset data for chunks
  for (unsigned int i = 0; i < num_parts; ++i) {
    if (exr_images[i].tiles) {
      const EXRImage* level_image = &exr_images[i];
      int num_levels = (exr_headers[i]->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) ?
        offset_data[i].num_x_levels : (offset_data[i].num_x_levels * offset_data[i].num_y_levels);
      for (int level_index = 0; level_index < num_levels; ++level_index) {
        for (size_t j = 0; j < offset_data[i].offsets[level_index].size(); ++j) {
          size_t num_bytes = sizeof(tinyexr_uint64) * offset_data[i].offsets[level_index][j].size();
          sum += num_bytes;
          assert(sum <= total_size);
          memcpy(memory_ptr,
                 reinterpret_cast<unsigned char*>(&offset_data[i].offsets[level_index][j][0]),
                 num_bytes);
          memory_ptr += num_bytes;
        }
        level_image = level_image->next_level;
      }
    } else {
      size_t num_bytes = sizeof(tinyexr::tinyexr_uint64) * static_cast<size_t>(chunk_count[i]);
      sum += num_bytes;
      assert(sum <= total_size);
      std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data[i].offsets[0][0];
      memcpy(memory_ptr, reinterpret_cast<unsigned char*>(&offsets[0]), num_bytes);
      memory_ptr += num_bytes;
    }
  }

  // Writing chunk data
  for (unsigned int i = 0; i < num_parts; ++i) {
    for (size_t j = 0; j < static_cast<size_t>(chunk_count[i]); ++j) {
      if (num_parts > 1) {
        sum += 4;
        assert(sum <= total_size);
        unsigned int part_number = i;
        swap4(&part_number);
        memcpy(memory_ptr, &part_number, 4);
        memory_ptr += 4;
      }
      sum += data_lists[i][j].size();
      assert(sum <= total_size);
      memcpy(memory_ptr, &data_lists[i][j][0], data_lists[i][j].size());
      memory_ptr += data_lists[i][j].size();
    }
  }
  assert(sum == total_size);
  return size_t(total_size);  // OK
}